

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O2

GradientStop * __thiscall
lunasvg::SVGStopElement::gradientStop
          (GradientStop *__return_storage_ptr__,SVGStopElement *this,float opacity)

{
  uint6 uVar1;
  Color CVar2;
  undefined1 auVar3 [16];
  plutovg_color_t pVar4;
  
  CVar2 = Color::colorWithAlpha(&this->m_stop_color,opacity * this->m_stop_opacity);
  __return_storage_ptr__->offset = *(float *)&(this->m_offset).super_SVGProperty.field_0xc;
  uVar1 = CONCAT24((short)(CVar2.m_value >> 8),CVar2.m_value >> 0x10) & 0xff000000ff;
  auVar3._0_4_ = (float)(int)uVar1;
  auVar3._4_4_ = (float)(ushort)(uVar1 >> 0x20);
  auVar3._8_4_ = (float)((ushort)CVar2.m_value & 0xff);
  auVar3._12_4_ = (float)(CVar2.m_value >> 0x18);
  pVar4 = (plutovg_color_t)divps(auVar3,_DAT_0013acd0);
  __return_storage_ptr__->color = pVar4;
  return __return_storage_ptr__;
}

Assistant:

GradientStop SVGStopElement::gradientStop(float opacity) const
{
    Color stopColor = m_stop_color.colorWithAlpha(m_stop_opacity * opacity);
    GradientStop gradientStop = {
        m_offset.value(), { stopColor.redF(), stopColor.greenF(), stopColor.blueF(), stopColor.alphaF() }
    };

    return gradientStop;
}